

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

StructReader * __thiscall
capnp::_::PointerReader::getStruct
          (StructReader *__return_storage_ptr__,PointerReader *this,word *defaultValue)

{
  WirePointer *pWVar1;
  int iVar2;
  word *pwVar3;
  CapTableReader *pCVar4;
  ulong uVar5;
  Arena *pAVar6;
  ulong uVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar10;
  WirePointer *pWVar11;
  ushort uVar12;
  uint uVar13;
  ushort uVar14;
  long lVar15;
  ulong uVar16;
  WirePointer *pWVar17;
  Fault f;
  Fault local_38;
  SegmentReader *pSVar9;
  
  pWVar17 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar17 = this->pointer;
  }
  pSVar9 = this->segment;
  pWVar1 = pWVar17 + 1;
  uVar13 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value;
  lVar15 = (long)((int)uVar13 >> 2);
  if (pSVar9 == (SegmentReader *)0x0) {
    pWVar11 = pWVar1 + lVar15;
  }
  else {
    pwVar3 = (pSVar9->ptr).ptr;
    pWVar11 = (WirePointer *)(pwVar3 + (pSVar9->ptr).size_);
    if (((long)pwVar3 - (long)pWVar1 >> 3 <= lVar15) &&
       (lVar15 <= (long)pWVar11 - (long)pWVar1 >> 3)) {
      pWVar11 = pWVar1 + lVar15;
    }
  }
  pCVar4 = this->capTable;
  iVar2 = this->nestingLimit;
  if ((pWVar17->field_1).upper32Bits == 0 && uVar13 == 0) {
LAB_003d92df:
    while( true ) {
      while( true ) {
        pWVar17 = (WirePointer *)defaultValue;
        if ((pWVar17 == (WirePointer *)0x0) ||
           (uVar13 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value,
           (pWVar17->field_1).upper32Bits == 0 && uVar13 == 0)) {
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->pointers = (WirePointer *)0x0;
          __return_storage_ptr__->segment = (SegmentReader *)0x0;
          __return_storage_ptr__->capTable = (CapTableReader *)0x0;
          *(undefined8 *)((long)&__return_storage_ptr__->pointers + 6) = 0;
          __return_storage_ptr__->nestingLimit = 0x7fffffff;
          return __return_storage_ptr__;
        }
        if (0 < iVar2) break;
        defaultValue = (word *)0x0;
LAB_003d93b4:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[76]>
                  (&local_38,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x86d,FAILED,"nestingLimit > 0",
                   "\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                   ,(char (*) [76])
                    "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
        kj::_::Debug::Fault::~Fault(&local_38);
      }
      defaultValue = (word *)0x0;
      if ((uVar13 & 3) == 0) break;
LAB_003d936d:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[71]>
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x879,FAILED,"ref->kind() == WirePointer::STRUCT",
                 "\"Message contains non-struct pointer where struct pointer was expected.\"",
                 (char (*) [71])
                 "Message contains non-struct pointer where struct pointer was expected.");
      kj::_::Debug::Fault::~Fault(&local_38);
    }
    pWVar11 = pWVar17 + (long)((int)uVar13 >> 2) + 1;
    uVar12 = *(ushort *)&pWVar17->field_1;
  }
  else {
    if (iVar2 < 1) goto LAB_003d93b4;
    if (pSVar9 == (SegmentReader *)0x0) {
      pSVar9 = (SegmentReader *)0x0;
LAB_003d9251:
      if (pWVar11 == (WirePointer *)0x0) goto LAB_003d92df;
LAB_003d925d:
      uVar13 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value;
    }
    else {
      if ((uVar13 & 3) != 2) goto LAB_003d9251;
      iVar8 = (*pSVar9->arena->_vptr_Arena[2])();
      pSVar9 = (SegmentReader *)CONCAT44(extraout_var,iVar8);
      if (pSVar9 == (SegmentReader *)0x0) {
        getStruct();
        goto LAB_003d92df;
      }
      uVar5 = (pSVar9->ptr).size_;
      uVar13 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value;
      uVar10 = (ulong)(uVar13 >> 3);
      if ((long)uVar5 < (long)(ulong)(uVar13 >> 3)) {
        uVar10 = uVar5;
      }
      uVar16 = 2 - (ulong)((uVar13 & 4) == 0);
      if (uVar5 < uVar10 + uVar16) {
LAB_003d92cc:
        getStruct();
        goto LAB_003d92df;
      }
      pwVar3 = (pSVar9->ptr).ptr;
      pAVar6 = pSVar9->arena;
      uVar7 = pSVar9->readLimiter->limit;
      if (uVar7 < uVar16) {
        (*pAVar6->_vptr_Arena[3])();
        goto LAB_003d92cc;
      }
      pWVar17 = (WirePointer *)(pwVar3 + uVar10);
      pWVar1 = pWVar17 + 1;
      pSVar9->readLimiter->limit = uVar7 - uVar16;
      if ((uVar13 & 4) != 0) {
        iVar8 = (*pAVar6->_vptr_Arena[2])(pAVar6,(ulong)(pWVar17->field_1).upper32Bits);
        pSVar9 = (SegmentReader *)CONCAT44(extraout_var_00,iVar8);
        if (pSVar9 == (SegmentReader *)0x0) {
          getStruct();
        }
        else {
          uVar13 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value;
          if ((uVar13 & 3) == 2) {
            uVar10 = (ulong)(uVar13 >> 3);
            uVar5 = (pSVar9->ptr).size_;
            if ((long)uVar5 < (long)uVar10) {
              uVar10 = uVar5;
            }
            pWVar11 = (WirePointer *)((pSVar9->ptr).ptr + uVar10);
            pWVar17 = pWVar1;
            goto LAB_003d9251;
          }
          getStruct();
        }
        goto LAB_003d92df;
      }
      uVar13 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value;
      lVar15 = (long)((int)uVar13 >> 2);
      pWVar11 = (WirePointer *)(pwVar3 + uVar5);
      if ((lVar15 < (long)pwVar3 - (long)pWVar1 >> 3) ||
         ((long)pWVar11 - (long)pWVar1 >> 3 < lVar15)) goto LAB_003d925d;
      pWVar11 = pWVar1 + lVar15;
    }
    if ((uVar13 & 3) != 0) goto LAB_003d936d;
    uVar12 = *(ushort *)&pWVar17->field_1;
    if (pSVar9 != (SegmentReader *)0x0) {
      uVar10 = (ulong)uVar12;
      uVar14 = (pWVar17->field_1).structRef.ptrCount.value;
      uVar5 = uVar10 + uVar14;
      if (((long)pWVar11 - (long)(pSVar9->ptr).ptr >> 3) + uVar5 <= (pSVar9->ptr).size_) {
        uVar16 = pSVar9->readLimiter->limit;
        if (uVar5 <= uVar16) {
          pSVar9->readLimiter->limit = uVar16 - uVar5;
          goto LAB_003d931b;
        }
        (*pSVar9->arena->_vptr_Arena[3])();
      }
      getStruct();
      goto LAB_003d92df;
    }
  }
  uVar10 = (ulong)uVar12;
  uVar14 = (pWVar17->field_1).structRef.ptrCount.value;
  pSVar9 = (SegmentReader *)0x0;
LAB_003d931b:
  __return_storage_ptr__->segment = pSVar9;
  __return_storage_ptr__->capTable = pCVar4;
  __return_storage_ptr__->data = pWVar11;
  __return_storage_ptr__->pointers = pWVar11 + uVar10;
  __return_storage_ptr__->dataSize = (uint)uVar12 << 6;
  __return_storage_ptr__->pointerCount = uVar14;
  __return_storage_ptr__->nestingLimit = iVar2 + -1;
  return __return_storage_ptr__;
}

Assistant:

StructReader PointerReader::getStruct(const word* defaultValue) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readStructPointer(segment, capTable, ref, defaultValue, nestingLimit);
}